

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_decals.cpp
# Opt level: O0

void DBaseDecal::SpreadLeft(double r,vertex_t *v1,side_t *feelwall,F3DFloor *ffloor)

{
  side_t **ppsVar1;
  uint uVar2;
  bool bVar3;
  vertex_t *local_70;
  vertex_t *v2;
  side_t *psStack_60;
  int i;
  side_t *nextwall;
  double wallsize;
  double y;
  double x;
  double startr;
  double ldy;
  double ldx;
  F3DFloor *ffloor_local;
  side_t *feelwall_local;
  vertex_t *v1_local;
  double r_local;
  
  ldx = (double)ffloor;
  ffloor_local = (F3DFloor *)feelwall;
  feelwall_local = (side_t *)v1;
  v1_local = (vertex_t *)r;
  TArray<side_t_*,_side_t_*>::Push(&SpreadStack,(side_t **)&ffloor_local);
  do {
    do {
      bVar3 = false;
      if ((double)v1_local < 0.0) {
        bVar3 = *(int *)&ffloor_local[1].bottom.model != -1;
      }
      if (!bVar3) {
        return;
      }
      x = (double)v1_local;
      y = vertex_t::fX((vertex_t *)feelwall_local);
      wallsize = vertex_t::fY((vertex_t *)feelwall_local);
      ffloor_local = (F3DFloor *)(sides + *(uint *)&ffloor_local[1].bottom.model);
      GetWallStuff((side_t *)ffloor_local,(vertex_t **)&feelwall_local,&ldy,&startr);
      nextwall = (side_t *)Length(ldy,startr);
      y = ((DecalLeft + (double)v1_local) * ldy) / (double)nextwall + y;
      wallsize = ((DecalLeft + (double)v1_local) * startr) / (double)nextwall + wallsize;
      v1_local = (vertex_t *)((double)nextwall + x);
      (*(SpreadSource->super_DThinker).super_DObject._vptr_DObject[10])
                (y,wallsize,SpreadZ,SpreadSource,SpreadTemplate,ffloor_local,ldx);
      TArray<side_t_*,_side_t_*>::Push(&SpreadStack,(side_t **)&ffloor_local);
      psStack_60 = NextWall((side_t *)ffloor_local);
    } while ((psStack_60 == (side_t *)0x0) || (psStack_60->LeftSide == 0xffffffff));
    v2._4_4_ = TArray<side_t_*,_side_t_*>::Size(&SpreadStack);
    do {
      uVar2 = v2._4_4_ - 1;
      bVar3 = (int)v2._4_4_ < 1;
      v2._4_4_ = uVar2;
      if (bVar3) break;
      ppsVar1 = TArray<side_t_*,_side_t_*>::operator[](&SpreadStack,(long)(int)uVar2);
    } while (*ppsVar1 != psStack_60);
    if (v2._4_4_ == 0xffffffff) {
      GetWallStuff(psStack_60,&local_70,&ldy,&startr);
      SpreadLeft(x,local_70,psStack_60,(F3DFloor *)ldx);
    }
  } while( true );
}

Assistant:

void DBaseDecal::SpreadLeft (double r, vertex_t *v1, side_t *feelwall, F3DFloor *ffloor)
{
	double ldx, ldy;

	SpreadStack.Push (feelwall);

	while (r < 0 && feelwall->LeftSide != NO_SIDE)
	{
		double startr = r;

		double x = v1->fX();
		double y = v1->fY();

		feelwall = &sides[feelwall->LeftSide];
		GetWallStuff (feelwall, v1, ldx, ldy);
		double wallsize = Length (ldx, ldy);
		r += DecalLeft;
		x += r*ldx / wallsize;
		y += r*ldy / wallsize;
		r = wallsize + startr;
		SpreadSource->CloneSelf (SpreadTemplate, x, y, SpreadZ, feelwall, ffloor);
		SpreadStack.Push (feelwall);

		side_t *nextwall = NextWall (feelwall);
		if (nextwall != NULL && nextwall->LeftSide != NO_SIDE)
		{
			int i;

			for (i = SpreadStack.Size(); i-- > 0; )
			{
				if (SpreadStack[i] == nextwall)
					break;
			}
			if (i == -1)
			{
				vertex_t *v2;

				GetWallStuff (nextwall, v2, ldx, ldy);
				SpreadLeft (startr, v2, nextwall, ffloor);
			}
		}
	}
}